

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall gimage::PNMImageIO::save(PNMImageIO *this,ImageU8 *image,char *name)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  long lVar5;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  failure *ex;
  int j;
  long i;
  long k;
  streambuf *sb;
  ofstream out;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc68;
  undefined6 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  byte bVar6;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long local_2b8 [46];
  float in_stack_fffffffffffffebc;
  long in_stack_fffffffffffffec0;
  long in_stack_fffffffffffffec8;
  long in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  allocator local_b1;
  string local_b0 [35];
  undefined1 local_8d;
  allocator local_79;
  string local_78 [96];
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,0);
  if (((uVar3 & 1) != 0) &&
     ((iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 == 1 ||
      (iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 == 3)))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"P5",&local_b1);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
    if (iVar2 == 3) {
      std::__cxx11::string::operator=(local_b0,"P6");
    }
    std::__cxx11::string::c_str();
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
    anon_unknown_11::writePNMHeader
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffebc);
    std::ofstream::ofstream(local_2b8);
    uVar4 = *(undefined8 *)(local_2b8[0] + -0x18);
    std::operator|(_S_failbit,_S_badbit);
    std::ios::exceptions((int)local_2b8 + (int)uVar4);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)local_2b8,(_Ios_Openmode)local_18);
    cVar1 = std::ofstream::rdbuf();
    local_2c8 = 0;
    while( true ) {
      lVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
      bVar6 = 0;
      if (local_2c8 < lVar5) {
        bVar6 = std::ios::good();
      }
      if ((bVar6 & 1) == 0) break;
      for (local_2d0 = 0;
          lVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
          local_2d0 < lVar5; local_2d0 = local_2d0 + 1) {
        for (local_2d4 = 0;
            iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
            local_2d4 < iVar2; local_2d4 = local_2d4 + 1) {
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                    (local_10,local_2d0,local_2c8,local_2d4);
          std::streambuf::sputc(cVar1);
        }
      }
      local_2c8 = local_2c8 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(local_2b8);
    std::__cxx11::string::~string(local_b0);
    return;
  }
  local_8d = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,local_18,&local_79);
  std::operator+((char *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  std::operator+(in_stack_fffffffffffffc38,(char *)in_stack_fffffffffffffc30);
  gutil::IOException::IOException
            ((IOException *)
             CONCAT17(in_stack_fffffffffffffc77,
                      CONCAT16(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70)),
             in_stack_fffffffffffffc68);
  local_8d = 0;
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNMImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNM images with depth 1 or 3 ("+std::string(name)+")");
  }

  std::string type="P5";

  if (image.getDepth() == 3)
  {
    type="P6";
  }

  writePNMHeader(name, type.c_str(), image.getWidth(), image.getHeight(),
                 255, 0);

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary|std::ios::app);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        for (int j=0; j<image.getDepth(); j++)
        {
          sb->sputc(static_cast<char>(image.get(i, k, j)));
        }
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}